

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

CURLcode concat_url(char *base,char *relurl,char **newurl)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  _Bool _Var4;
  CURLcode CVar5;
  CURLUcode CVar6;
  char *sep;
  char *pcVar7;
  char *pcVar8;
  size_t len;
  char *pcVar9;
  char *pcVar10;
  int iVar11;
  dynbuf newest;
  _Bool local_5c;
  dynbuf local_50;
  
  *newurl = (char *)0x0;
  pcVar7 = strstr(base,"//");
  pcVar9 = pcVar7 + 2;
  if (pcVar7 == (char *)0x0) {
    pcVar9 = base;
  }
  cVar2 = *relurl;
  if (cVar2 == '/') {
    pcVar7 = pcVar9;
    if (relurl[1] == '/') {
      *pcVar9 = '\0';
      relurl = relurl + 2;
      _Var4 = false;
    }
    else {
      pcVar8 = strchr(pcVar9,0x2f);
      pcVar9 = strchr(pcVar9,0x3f);
      if (pcVar8 == (char *)0x0) {
        if (pcVar9 != (char *)0x0) {
          *pcVar9 = '\0';
          _Var4 = true;
          goto LAB_00163651;
        }
      }
      else {
        pcVar10 = pcVar8;
        if (pcVar9 < pcVar8) {
          pcVar10 = pcVar9;
        }
        if (pcVar9 == (char *)0x0) {
          pcVar10 = pcVar8;
        }
        *pcVar10 = '\0';
      }
      _Var4 = true;
    }
LAB_00163651:
    local_5c = _Var4;
    pcVar9 = pcVar7;
    bVar3 = false;
  }
  else {
    pcVar7 = strchr(pcVar9,0x3f);
    if (pcVar7 != (char *)0x0) {
      *pcVar7 = '\0';
      cVar2 = *relurl;
    }
    if ((cVar2 != '#') && (cVar2 != '?')) {
      _Var4 = true;
      local_5c = true;
      pcVar7 = strrchr(pcVar9,0x2f);
      if (pcVar7 != (char *)0x0) {
        *pcVar7 = '\0';
        cVar2 = *relurl;
      }
      pcVar8 = strchr(pcVar9,0x2f);
      pcVar7 = pcVar8 + 1;
      pcVar9 = pcVar7;
      if (pcVar8 == (char *)0x0) {
        pcVar9 = (char *)0x0;
      }
      iVar11 = 0;
      if ((cVar2 == '.') && (relurl = relurl + (ulong)(relurl[1] == '/') * 2, *relurl == '.')) {
        iVar11 = 0;
        pcVar10 = relurl;
        do {
          relurl = pcVar10;
          if ((pcVar10[1] != '.') || (pcVar10[2] != '/')) break;
          iVar11 = iVar11 + 1;
          relurl = pcVar10 + 3;
          pcVar1 = pcVar10 + 3;
          pcVar10 = relurl;
        } while (*pcVar1 == '.');
      }
      if (pcVar8 == (char *)0x0) {
        pcVar7 = (char *)0x0;
      }
      else if (iVar11 != 0) {
        do {
          pcVar8 = strrchr(pcVar9,0x2f);
          if (pcVar8 == (char *)0x0) {
            *pcVar9 = '\0';
            goto LAB_00163651;
          }
          *pcVar8 = '\0';
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
        bVar3 = false;
        goto LAB_00163653;
      }
      goto LAB_00163651;
    }
    local_5c = true;
    bVar3 = true;
  }
LAB_00163653:
  Curl_dyn_init(&local_50,8000000);
  CVar5 = Curl_dyn_add(&local_50,base);
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
  if (*relurl != '/') {
    if (pcVar9 == (char *)0x0) {
      if (bVar3) goto LAB_001636b2;
    }
    else if (bVar3 || *pcVar9 == '\0') goto LAB_001636b2;
    CVar5 = Curl_dyn_addn(&local_50,"/",1);
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
  }
LAB_001636b2:
  len = strlen(relurl);
  CVar5 = CURLE_OK;
  CVar6 = urlencode_str(&local_50,relurl,len,local_5c,false);
  if (CVar6 == CURLUE_OK) {
    pcVar9 = Curl_dyn_ptr(&local_50);
    *newurl = pcVar9;
  }
  else {
    CVar5 = CURLE_OUT_OF_MEMORY;
    if (CVar6 == CURLUE_TOO_LARGE) {
      CVar5 = CURLE_TOO_LARGE;
    }
  }
  return CVar5;
}

Assistant:

static CURLcode concat_url(char *base, const char *relurl, char **newurl)
{
  /***
   TRY to append this new path to the old URL
   to the right of the host part. Oh crap, this is doomed to cause
   problems in the future...
  */
  struct dynbuf newest;
  char *protsep;
  char *pathsep;
  bool host_changed = FALSE;
  const char *useurl = relurl;
  CURLcode result = CURLE_OK;
  CURLUcode uc;
  bool skip_slash = FALSE;
  *newurl = NULL;

  /* protsep points to the start of the hostname */
  protsep = strstr(base, "//");
  if(!protsep)
    protsep = base;
  else
    protsep += 2; /* pass the slashes */

  if('/' != relurl[0]) {
    int level = 0;

    /* First we need to find out if there is a ?-letter in the URL,
       and cut it and the right-side of that off */
    pathsep = strchr(protsep, '?');
    if(pathsep)
      *pathsep = 0;

    /* we have a relative path to append to the last slash if there is one
       available, or the new URL is just a query string (starts with a '?') or
       a fragment (starts with '#') we append the new one at the end of the
       current URL */
    if((useurl[0] != '?') && (useurl[0] != '#')) {
      pathsep = strrchr(protsep, '/');
      if(pathsep)
        *pathsep = 0;

      /* Check if there is any slash after the hostname, and if so, remember
         that position instead */
      pathsep = strchr(protsep, '/');
      if(pathsep)
        protsep = pathsep + 1;
      else
        protsep = NULL;

      /* now deal with one "./" or any amount of "../" in the newurl
         and act accordingly */

      if((useurl[0] == '.') && (useurl[1] == '/'))
        useurl += 2; /* just skip the "./" */

      while((useurl[0] == '.') &&
            (useurl[1] == '.') &&
            (useurl[2] == '/')) {
        level++;
        useurl += 3; /* pass the "../" */
      }

      if(protsep) {
        while(level--) {
          /* cut off one more level from the right of the original URL */
          pathsep = strrchr(protsep, '/');
          if(pathsep)
            *pathsep = 0;
          else {
            *protsep = 0;
            break;
          }
        }
      }
    }
    else
      skip_slash = TRUE;
  }
  else {
    /* We got a new absolute path for this server */

    if(relurl[1] == '/') {
      /* the new URL starts with //, just keep the protocol part from the
         original one */
      *protsep = 0;
      useurl = &relurl[2]; /* we keep the slashes from the original, so we
                              skip the new ones */
      host_changed = TRUE;
    }
    else {
      /* cut off the original URL from the first slash, or deal with URLs
         without slash */
      pathsep = strchr(protsep, '/');
      if(pathsep) {
        /* When people use badly formatted URLs, such as
           "http://www.example.com?dir=/home/daniel" we must not use the first
           slash, if there is a ?-letter before it! */
        char *sep = strchr(protsep, '?');
        if(sep && (sep < pathsep))
          pathsep = sep;
        *pathsep = 0;
      }
      else {
        /* There was no slash. Now, since we might be operating on a badly
           formatted URL, such as "http://www.example.com?id=2380" which does
           not use a slash separator as it is supposed to, we need to check
           for a ?-letter as well! */
        pathsep = strchr(protsep, '?');
        if(pathsep)
          *pathsep = 0;
      }
    }
  }

  Curl_dyn_init(&newest, CURL_MAX_INPUT_LENGTH);

  /* copy over the root URL part */
  result = Curl_dyn_add(&newest, base);
  if(result)
    return result;

  /* check if we need to append a slash */
  if(('/' == useurl[0]) || (protsep && !*protsep) || skip_slash)
    ;
  else {
    result = Curl_dyn_addn(&newest, "/", 1);
    if(result)
      return result;
  }

  /* then append the new piece on the right side */
  uc = urlencode_str(&newest, useurl, strlen(useurl), !host_changed,
                     FALSE);
  if(uc)
    return (uc == CURLUE_TOO_LARGE) ? CURLE_TOO_LARGE : CURLE_OUT_OF_MEMORY;

  *newurl = Curl_dyn_ptr(&newest);
  return CURLE_OK;
}